

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O0

void __thiscall
Assimp::MakeVerboseFormatProcess::Execute(MakeVerboseFormatProcess *this,aiScene *pScene)

{
  bool bVar1;
  bool bVar2;
  Logger *pLVar3;
  uint local_20;
  uint a;
  bool bHas;
  aiScene *pScene_local;
  MakeVerboseFormatProcess *this_local;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/MakeVerboseFormat.cpp"
                  ,0x43,"virtual void Assimp::MakeVerboseFormatProcess::Execute(aiScene *)");
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"MakeVerboseFormatProcess begin");
  bVar1 = false;
  for (local_20 = 0; local_20 < pScene->mNumMeshes; local_20 = local_20 + 1) {
    bVar2 = MakeVerboseFormat(this,pScene->mMeshes[local_20]);
    if (bVar2) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"MakeVerboseFormatProcess finished. There was much work to do ...");
  }
  else {
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"MakeVerboseFormatProcess. There was nothing to do.");
  }
  pScene->mFlags = pScene->mFlags & 0xfffffff7;
  return;
}

Assistant:

void MakeVerboseFormatProcess::Execute( aiScene* pScene)
{
    ai_assert(NULL != pScene);
    ASSIMP_LOG_DEBUG("MakeVerboseFormatProcess begin");

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
    {
        if( MakeVerboseFormat( pScene->mMeshes[a]))
            bHas = true;
    }
    if (bHas) {
        ASSIMP_LOG_INFO("MakeVerboseFormatProcess finished. There was much work to do ...");
    } else {
        ASSIMP_LOG_DEBUG("MakeVerboseFormatProcess. There was nothing to do.");
    }

    pScene->mFlags &= ~AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
}